

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

void __thiscall ncnn::Mat::~Mat(Mat *this)

{
  int *piVar1;
  
  piVar1 = this->refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (this->allocator == (Allocator *)0x0) {
        if (this->data != (void *)0x0) {
          free(this->data);
        }
      }
      else {
        (*this->allocator->_vptr_Allocator[3])();
      }
    }
  }
  this->cstep = 0;
  this->data = (void *)0x0;
  this->refcount = (int *)0x0;
  *(undefined8 *)((long)&this->refcount + 4) = 0;
  *(undefined8 *)((long)&this->elemsize + 4) = 0;
  this->dims = 0;
  this->w = 0;
  this->h = 0;
  this->d = 0;
  this->c = 0;
  return;
}

Assistant:

inline Mat::~Mat()
{
    release();
}